

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

void duckdb::alp::AlpCompression<float,_true>::Compress
               (float *input_vector,idx_t n_values,uint16_t *vector_null_positions,idx_t nulls_count
               ,State *state)

{
  float fVar1;
  long lVar2;
  uint64_t uVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar6;
  reference pvVar7;
  unsigned_long uVar8;
  byte bVar9;
  long lVar10;
  int64_t iVar11;
  uint64_t uVar12;
  ulong uVar13;
  idx_t iVar14;
  ushort uVar15;
  uint64_t uVar16;
  float fVar17;
  long local_38;
  
  if ((ulong)(((long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2) {
    pvVar7 = vector<duckdb::alp::AlpCombination,_true>::operator[](&state->best_k_combinations,0);
    state->vector_encoding_indices = pvVar7->encoding_indices;
  }
  else {
    FindBestFactorAndExponent(input_vector,n_values,state);
  }
  uVar12 = 0x7fffffffffffffff;
  if (n_values == 0) {
    uVar6 = 0;
  }
  else {
    local_38 = 0x7ffffffffffffc00;
    iVar14 = 0;
    uVar15 = 0;
    do {
      fVar1 = input_vector[iVar14];
      fVar17 = *(float *)(AlpTypedConstants<float>::EXP_ARR +
                         (ulong)((ushort)state->vector_encoding_indices & 0xff) * 4) * fVar1 *
               *(float *)(AlpTypedConstants<float>::FRAC_ARR +
                         (ulong)((ushort)state->vector_encoding_indices >> 8) * 4);
      bVar4 = IsImpossibleToEncode(fVar17);
      lVar10 = (long)(fVar17 + 12582912.0 + -12582912.0);
      if (bVar4) {
        lVar10 = local_38;
      }
      lVar2 = *(long *)(AlpConstants::FACT_ARR +
                       (ulong)((ushort)state->vector_encoding_indices >> 8) * 8);
      fVar17 = *(float *)(AlpTypedConstants<float>::FRAC_ARR +
                         (ulong)((ushort)state->vector_encoding_indices & 0xff) * 4);
      state->encoded_integers[iVar14] = lVar10;
      uVar6 = uVar15 + ((float)lVar2 * (float)lVar10 * fVar17 != fVar1);
      state->exceptions_positions[uVar15] = (uint16_t)iVar14;
      iVar14 = iVar14 + 1;
      uVar15 = uVar6;
    } while (n_values != iVar14);
  }
  iVar11 = 0;
  if (n_values != 0) {
    iVar14 = 0;
    do {
      if (iVar14 != state->exceptions_positions[iVar14]) {
        iVar11 = state->encoded_integers[iVar14];
        break;
      }
      iVar14 = iVar14 + 1;
    } while (n_values != iVar14);
  }
  if (uVar6 != 0) {
    uVar13 = 0;
    do {
      fVar1 = input_vector[state->exceptions_positions[uVar13]];
      state->encoded_integers[state->exceptions_positions[uVar13]] = iVar11;
      state->exceptions[uVar13] = fVar1;
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  state->exceptions_count = uVar6;
  if (nulls_count != 0) {
    iVar14 = 0;
    do {
      state->encoded_integers[vector_null_positions[iVar14]] = iVar11;
      iVar14 = iVar14 + 1;
    } while (nulls_count != iVar14);
  }
  uVar16 = 0x8000000000000000;
  if (n_values != 0) {
    iVar14 = 0;
    uVar12 = 0x7fffffffffffffff;
    do {
      uVar3 = state->encoded_integers[iVar14];
      if ((long)uVar16 <= (long)uVar3) {
        uVar16 = uVar3;
      }
      if ((long)uVar12 < (long)uVar3) {
        uVar3 = uVar12;
      }
      uVar12 = uVar3;
      iVar14 = iVar14 + 1;
    } while (n_values != iVar14);
  }
  if ((n_values & 0x1f) != 0) {
    uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)n_values & 0x1f);
    n_values = (n_values - uVar8) + 0x20;
  }
  uVar13 = uVar16 - uVar12;
  lVar10 = 0x3f;
  if (uVar13 != 0) {
    for (; uVar13 >> lVar10 == 0; lVar10 = lVar10 + -1) {
    }
  }
  bVar9 = 0x40;
  if (uVar13 >> 0x38 == 0) {
    bVar9 = 0x40 - ((byte)lVar10 ^ 0x3f);
  }
  bVar5 = 0;
  if (uVar16 != uVar12) {
    bVar5 = bVar9;
  }
  state->bit_width = (ushort)bVar5;
  state->bp_size = bVar5 * n_values >> 3;
  state->frame_of_reference = uVar12;
  return;
}

Assistant:

static void Compress(const T *input_vector, idx_t n_values, const uint16_t *vector_null_positions,
	                     idx_t nulls_count, State &state) {
		if (state.best_k_combinations.size() > 1) {
			FindBestFactorAndExponent(input_vector, n_values, state);
		} else {
			state.vector_encoding_indices = state.best_k_combinations[0].encoding_indices;
		}

		// Encoding Floating-Point to Int64
		//! We encode all the values regardless of their correctness to recover the original floating-point
		uint16_t exceptions_idx = 0;
		for (idx_t i = 0; i < n_values; i++) {
			T actual_value = input_vector[i];
			int64_t encoded_value = EncodeValue(actual_value, state.vector_encoding_indices);
			T decoded_value = DecodeValue(encoded_value, state.vector_encoding_indices);
			state.encoded_integers[i] = encoded_value;
			//! We detect exceptions using a predicated comparison
			auto is_exception = (decoded_value != actual_value);
			state.exceptions_positions[exceptions_idx] = UnsafeNumericCast<uint16_t>(i);
			exceptions_idx += is_exception;
		}

		// Finding first non exception value
		int64_t a_non_exception_value = 0;
		for (idx_t i = 0; i < n_values; i++) {
			if (i != state.exceptions_positions[i]) {
				a_non_exception_value = state.encoded_integers[i];
				break;
			}
		}
		// Replacing that first non exception value on the vector exceptions
		for (idx_t i = 0; i < exceptions_idx; i++) {
			idx_t exception_pos = state.exceptions_positions[i];
			T actual_value = input_vector[exception_pos];
			state.encoded_integers[exception_pos] = a_non_exception_value;
			state.exceptions[i] = actual_value;
		}
		state.exceptions_count = exceptions_idx;

		// Replacing nulls with that first non exception value
		for (idx_t i = 0; i < nulls_count; i++) {
			uint16_t null_value_pos = vector_null_positions[i];
			state.encoded_integers[null_value_pos] = a_non_exception_value;
		}

		// Analyze FFOR
		auto min_value = NumericLimits<int64_t>::Maximum();
		auto max_value = NumericLimits<int64_t>::Minimum();
		for (idx_t i = 0; i < n_values; i++) {
			max_value = MaxValue(max_value, state.encoded_integers[i]);
			min_value = MinValue(min_value, state.encoded_integers[i]);
		}
		uint64_t min_max_diff = (static_cast<uint64_t>(max_value) - static_cast<uint64_t>(min_value));

		auto *u_encoded_integers = reinterpret_cast<uint64_t *>(state.encoded_integers);
		auto const u_min_value = static_cast<uint64_t>(min_value);

		// Subtract FOR
		if (!EMPTY) { //! We only execute the FOR if we are writing the data
			for (idx_t i = 0; i < n_values; i++) {
				u_encoded_integers[i] -= u_min_value;
			}
		}

		auto bit_width = BitpackingPrimitives::MinimumBitWidth<uint64_t, false>(min_max_diff);
		auto bp_size = BitpackingPrimitives::GetRequiredSize(n_values, bit_width);
		if (!EMPTY && bit_width > 0) { //! We only execute the BP if we are writing the data
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.values_encoded, u_encoded_integers, n_values,
			                                                  bit_width);
		}
		state.bit_width = bit_width;                                 // in bits
		state.bp_size = bp_size;                                     // in bytes
		state.frame_of_reference = static_cast<uint64_t>(min_value); // understood this can be negative
	}